

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O1

void __thiscall AwsCommandRunner::Remove(AwsCommandRunner *this,string *path)

{
  MultipleCommandRunner *pMVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string full_url;
  allocator_type local_109;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  GetFullUrl(&local_f0,this,path);
  pMVar1 = this->command_runner_;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"aws","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"s3","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"rm","");
  plVar2 = local_60;
  local_70[0] = plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_f0._M_dataplus._M_p,
             local_f0._M_dataplus._M_p + local_f0._M_string_length);
  __l._M_len = 4;
  __l._M_array = &local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,__l,&local_109);
  MultipleCommandRunner::RunCommand(pMVar1,&local_108,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  lVar3 = -0x80;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  pMVar1 = this->command_runner_;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"aws","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"s3","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"rm","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"--recursive","");
  plVar2 = local_40;
  local_50[0] = plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_f0._M_dataplus._M_p,
             local_f0._M_dataplus._M_p + local_f0._M_string_length);
  __l_00._M_len = 5;
  __l_00._M_array = &local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,__l_00,&local_109);
  MultipleCommandRunner::RunCommand(pMVar1,&local_108,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  lVar3 = -0xa0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AwsCommandRunner::Remove(const std::string& path) {
  std::string full_url = GetFullUrl(path);
  command_runner_->RunCommand({"aws", "s3", "rm", full_url}, true);
  command_runner_->RunCommand({"aws", "s3", "rm", "--recursive", full_url},
                              false);
}